

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenVerifyCall(CppGenerator *this,FieldDef *field,char *prefix)

{
  CodeWriter *this_00;
  Value *type;
  BaseType BVar1;
  size_t t;
  char *__s;
  string *psVar2;
  char *__s_00;
  string nfn;
  allocator<char> local_1ca;
  allocator<char> local_1c9;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"PRE",&local_1ca);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,prefix,&local_1c9);
  this_00 = &this->code_;
  CodeWriter::SetValue(this_00,&local_1c8,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"NAME",&local_1ca);
  Name_abi_cxx11_(&local_1a8,this,field);
  CodeWriter::SetValue(this_00,&local_1c8,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"REQUIRED",&local_1ca);
  __s = "Required";
  __s_00 = "";
  if (field->presence != kRequired) {
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,__s,&local_1c9);
  CodeWriter::SetValue(this_00,&local_1c8,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"SIZE",&local_1ca);
  type = &field->value;
  GenTypeSize_abi_cxx11_(&local_1a8,this,&type->type);
  CodeWriter::SetValue(this_00,&local_1c8,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"OFFSET",&local_1ca);
  GenFieldOffsetName_abi_cxx11_(&local_1a8,this,field);
  CodeWriter::SetValue(this_00,&local_1c8,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  BVar1 = (type->type).base_type;
  if ((BVar1 - BASE_TYPE_UTYPE < 0xc) ||
     ((BVar1 == BASE_TYPE_STRUCT && (((field->value).type.struct_def)->fixed == true)))) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"ALIGN",&local_1ca);
    t = InlineAlignment(&type->type);
    NumToString<unsigned_long>(&local_1a8,t);
    CodeWriter::SetValue(this_00,&local_1c8,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "{{PRE}}VerifyField{{REQUIRED}}<{{SIZE}}>(verifier, {{OFFSET}}, {{ALIGN}})\\",
               (allocator<char> *)&local_1c8);
    CodeWriter::operator+=(this_00,&local_48);
    psVar2 = &local_48;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"OFFSET_SIZE",&local_1ca);
    if (field->offset64 != false) {
      __s_00 = "64";
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,__s_00,&local_1c9);
    CodeWriter::SetValue(this_00,&local_1c8,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,
               "{{PRE}}VerifyOffset{{OFFSET_SIZE}}{{REQUIRED}}(verifier, {{OFFSET}})\\",
               (allocator<char> *)&local_1c8);
    CodeWriter::operator+=(this_00,&local_68);
    psVar2 = &local_68;
  }
  std::__cxx11::string::~string((string *)psVar2);
  switch((type->type).base_type) {
  case BASE_TYPE_STRING:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"{{PRE}}verifier.VerifyString({{NAME}}())\\",
               (allocator<char> *)&local_1c8);
    CodeWriter::operator+=(this_00,&local_c8);
    psVar2 = &local_c8;
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_VECTOR64:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"{{PRE}}verifier.VerifyVector({{NAME}}())\\",
               (allocator<char> *)&local_1c8);
    CodeWriter::operator+=(this_00,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    BVar1 = (field->value).type.element;
    if (BVar1 == BASE_TYPE_STRING) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"{{PRE}}verifier.VerifyVectorOfStrings({{NAME}}())\\",
                 (allocator<char> *)&local_1c8);
      CodeWriter::operator+=(this_00,&local_108);
      psVar2 = &local_108;
LAB_0016762f:
      std::__cxx11::string::~string((string *)psVar2);
    }
    else if (BVar1 == BASE_TYPE_STRUCT) {
      if (((field->value).type.struct_def)->fixed == false) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"{{PRE}}verifier.VerifyVectorOfTables({{NAME}}())\\",
                   (allocator<char> *)&local_1c8);
        CodeWriter::operator+=(this_00,&local_128);
        psVar2 = &local_128;
        goto LAB_0016762f;
      }
    }
    else if (BVar1 == BASE_TYPE_UNION) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,"ENUM_NAME",(allocator<char> *)&local_1a8);
      CodeWriter::SetValue(this_00,&local_1c8,(string *)(field->value).type.enum_def);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,
                 "{{PRE}}Verify{{ENUM_NAME}}Vector(verifier, {{NAME}}(), {{NAME}}_type())\\",
                 (allocator<char> *)&local_1c8);
      CodeWriter::operator+=(this_00,&local_148);
      psVar2 = &local_148;
      goto LAB_0016762f;
    }
    GetNestedFlatBufferName_abi_cxx11_(&local_1c8,this,field);
    if (local_1c8._M_string_length == 0) {
      if (field->flexbuffer == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,
                   "{{PRE}}flexbuffers::VerifyNestedFlexBuffer({{NAME}}(), verifier)\\",
                   (allocator<char> *)&local_1a8);
        CodeWriter::operator+=(this_00,&local_188);
        psVar2 = &local_188;
        goto LAB_001676dd;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"CPP_NAME",&local_1ca)
      ;
      CodeWriter::SetValue(this_00,&local_1a8,&local_1c8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,
                 "{{PRE}}verifier.VerifyNestedFlatBuffer<{{CPP_NAME}}>({{NAME}}(), nullptr)\\",
                 (allocator<char> *)&local_1a8);
      CodeWriter::operator+=(this_00,&local_168);
      psVar2 = &local_168;
LAB_001676dd:
      std::__cxx11::string::~string((string *)psVar2);
    }
    psVar2 = &local_1c8;
    break;
  case BASE_TYPE_STRUCT:
    if (((field->value).type.struct_def)->fixed != false) {
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"{{PRE}}verifier.VerifyTable({{NAME}}())\\",
               (allocator<char> *)&local_1c8);
    CodeWriter::operator+=(this_00,&local_a8);
    psVar2 = &local_a8;
    break;
  case BASE_TYPE_UNION:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"ENUM_NAME",(allocator<char> *)&local_1a8);
    CodeWriter::SetValue(this_00,&local_1c8,(string *)(field->value).type.enum_def);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"SUFFIX",&local_1ca);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"_type",&local_1c9);
    CodeWriter::SetValue(this_00,&local_1c8,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               "{{PRE}}Verify{{ENUM_NAME}}(verifier, {{NAME}}(), {{NAME}}{{SUFFIX}}())\\",
               (allocator<char> *)&local_1c8);
    CodeWriter::operator+=(this_00,&local_88);
    psVar2 = &local_88;
    break;
  default:
    goto switchD_001673bb_caseD_11;
  }
  std::__cxx11::string::~string((string *)psVar2);
switchD_001673bb_caseD_11:
  return;
}

Assistant:

void GenVerifyCall(const FieldDef &field, const char *prefix) {
    code_.SetValue("PRE", prefix);
    code_.SetValue("NAME", Name(field));
    code_.SetValue("REQUIRED", field.IsRequired() ? "Required" : "");
    code_.SetValue("SIZE", GenTypeSize(field.value.type));
    code_.SetValue("OFFSET", GenFieldOffsetName(field));
    if (IsScalar(field.value.type.base_type) || IsStruct(field.value.type)) {
      code_.SetValue("ALIGN", NumToString(InlineAlignment(field.value.type)));
      code_ +=
          "{{PRE}}VerifyField{{REQUIRED}}<{{SIZE}}>(verifier, "
          "{{OFFSET}}, {{ALIGN}})\\";
    } else {
      code_.SetValue("OFFSET_SIZE", field.offset64 ? "64" : "");
      code_ +=
          "{{PRE}}VerifyOffset{{OFFSET_SIZE}}{{REQUIRED}}(verifier, "
          "{{OFFSET}})\\";
    }

    switch (field.value.type.base_type) {
      case BASE_TYPE_UNION: {
        code_.SetValue("ENUM_NAME", field.value.type.enum_def->name);
        code_.SetValue("SUFFIX", UnionTypeFieldSuffix());
        code_ +=
            "{{PRE}}Verify{{ENUM_NAME}}(verifier, {{NAME}}(), "
            "{{NAME}}{{SUFFIX}}())\\";
        break;
      }
      case BASE_TYPE_STRUCT: {
        if (!field.value.type.struct_def->fixed) {
          code_ += "{{PRE}}verifier.VerifyTable({{NAME}}())\\";
        }
        break;
      }
      case BASE_TYPE_STRING: {
        code_ += "{{PRE}}verifier.VerifyString({{NAME}}())\\";
        break;
      }
      case BASE_TYPE_VECTOR64:
      case BASE_TYPE_VECTOR: {
        code_ += "{{PRE}}verifier.VerifyVector({{NAME}}())\\";

        switch (field.value.type.element) {
          case BASE_TYPE_STRING: {
            code_ += "{{PRE}}verifier.VerifyVectorOfStrings({{NAME}}())\\";
            break;
          }
          case BASE_TYPE_STRUCT: {
            if (!field.value.type.struct_def->fixed) {
              code_ += "{{PRE}}verifier.VerifyVectorOfTables({{NAME}}())\\";
            }
            break;
          }
          case BASE_TYPE_UNION: {
            code_.SetValue("ENUM_NAME", field.value.type.enum_def->name);
            code_ +=
                "{{PRE}}Verify{{ENUM_NAME}}Vector(verifier, {{NAME}}(), "
                "{{NAME}}_type())\\";
            break;
          }
          default: break;
        }

        auto nfn = GetNestedFlatBufferName(field);
        if (!nfn.empty()) {
          code_.SetValue("CPP_NAME", nfn);
          // FIXME: file_identifier.
          code_ +=
              "{{PRE}}verifier.VerifyNestedFlatBuffer<{{CPP_NAME}}>"
              "({{NAME}}(), nullptr)\\";
        } else if (field.flexbuffer) {
          code_ +=
              "{{PRE}}flexbuffers::VerifyNestedFlexBuffer"
              "({{NAME}}(), verifier)\\";
        }
        break;
      }
      default: {
        break;
      }
    }
  }